

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gls::BuiltinPrecisionTests::
InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
::operator()(InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
             *this,InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                   *in1,
            InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *in2)

{
  bool bVar1;
  Matrix<float,_2,_4> *mat1;
  bool bVar2;
  Matrix<float,_2,_4> *mat2;
  InputLess<tcu::Matrix<float,_2,_4>_> local_1c;
  InputLess<tcu::Matrix<float,_2,_4>_> local_1b;
  InputLess<tcu::Matrix<float,_2,_4>_> local_1a;
  InputLess<tcu::Matrix<float,_2,_4>_> local_19;
  
  bVar1 = InputLess<tcu::Matrix<float,_2,_4>_>::operator()
                    (&local_1c,(Matrix<float,_2,_4> *)in1,(Matrix<float,_2,_4> *)in2);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = InputLess<tcu::Matrix<float,_2,_4>_>::operator()
                      (&local_1b,(Matrix<float,_2,_4> *)in2,(Matrix<float,_2,_4> *)in1);
    if (!bVar1) {
      mat1 = &(in1->
              super_Tuple4<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
              ).b;
      mat2 = &(in2->
              super_Tuple4<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
              ).b;
      bVar1 = InputLess<tcu::Matrix<float,_2,_4>_>::operator()(&local_1a,mat1,mat2);
      if (bVar1) {
        return true;
      }
      InputLess<tcu::Matrix<float,_2,_4>_>::operator()(&local_19,mat2,mat1);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator() (const InTuple<In>& in1, const InTuple<In>& in2) const
	{
		if (inputLess(in1.a, in2.a))
			return true;
		if (inputLess(in2.a, in1.a))
			return false;
		if (inputLess(in1.b, in2.b))
			return true;
		if (inputLess(in2.b, in1.b))
			return false;
		if (inputLess(in1.c, in2.c))
			return true;
		if (inputLess(in2.c, in1.c))
			return false;
		if (inputLess(in1.d, in2.d))
			return true;
		return false;
	}